

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImGuiViewportP::ImGuiViewportP(ImGuiViewportP *this)

{
  (this->super_ImGuiViewport).PlatformHandleRaw = (void *)0x0;
  (this->super_ImGuiViewport).PlatformRequestMove = false;
  (this->super_ImGuiViewport).PlatformRequestResize = false;
  (this->super_ImGuiViewport).PlatformRequestClose = false;
  *(undefined5 *)&(this->super_ImGuiViewport).field_0x5b = 0;
  (this->super_ImGuiViewport).PlatformUserData = (void *)0x0;
  (this->super_ImGuiViewport).PlatformHandle = (void *)0x0;
  (this->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
  (this->super_ImGuiViewport).RendererUserData = (void *)0x0;
  (this->super_ImGuiViewport).WorkSize.x = 0.0;
  (this->super_ImGuiViewport).WorkSize.y = 0.0;
  (this->super_ImGuiViewport).DpiScale = 0.0;
  (this->super_ImGuiViewport).ParentViewportId = 0;
  (this->super_ImGuiViewport).Size.x = 0.0;
  (this->super_ImGuiViewport).Size.y = 0.0;
  (this->super_ImGuiViewport).WorkPos.x = 0.0;
  (this->super_ImGuiViewport).WorkPos.y = 0.0;
  (this->super_ImGuiViewport).ID = 0;
  (this->super_ImGuiViewport).Flags = 0;
  (this->super_ImGuiViewport).Pos.x = 0.0;
  (this->super_ImGuiViewport).Pos.y = 0.0;
  memset(&this->DrawDataP,0,0x90);
  this->DrawListsLastFrame[0] = -1;
  this->DrawListsLastFrame[1] = -1;
  *(undefined8 *)&(this->super_ImGuiViewport).field_0x5c = 0xffffffffffffffff;
  this->LastFrontMostStampCount = -1;
  this->LastNameHash = 0;
  (this->LastPos).x = 0.0;
  (this->LastPos).y = 0.0;
  this->Alpha = 1.0;
  this->LastAlpha = 1.0;
  this->PlatformMonitor = -1;
  this->PlatformWindowCreated = false;
  this->Window = (ImGuiWindow *)0x0;
  this->DrawLists[0] = (ImDrawList *)0x0;
  this->DrawLists[1] = (ImDrawList *)0x0;
  (this->LastRendererSize).x = 3.4028235e+38;
  (this->LastRendererSize).y = 3.4028235e+38;
  (this->LastPlatformPos).x = 3.4028235e+38;
  (this->LastPlatformPos).y = 3.4028235e+38;
  (this->LastPlatformSize).x = 3.4028235e+38;
  (this->LastPlatformSize).y = 3.4028235e+38;
  return;
}

Assistant:

ImGuiViewportP()                    { Idx = -1; LastFrameActive = DrawListsLastFrame[0] = DrawListsLastFrame[1] = LastFrontMostStampCount = -1; LastNameHash = 0; Alpha = LastAlpha = 1.0f; PlatformMonitor = -1; PlatformWindowCreated = false; Window = NULL; DrawLists[0] = DrawLists[1] = NULL; LastPlatformPos = LastPlatformSize = LastRendererSize = ImVec2(FLT_MAX, FLT_MAX); }